

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,std::__cxx11::string>>>
::nosize_unchecked_emplace_at<std::pair<slang::DiagCode&&,std::__cxx11::string&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,std::__cxx11::string>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<slang::DiagCode_&&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  value_type_pointer ppVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  pointer pcVar7;
  uint uVar8;
  ushort uVar9;
  size_type sVar10;
  long lVar11;
  value_type_pointer ppVar12;
  ulong uVar13;
  group_type_pointer pgVar14;
  undefined1 auVar15 [16];
  
  pgVar14 = __return_storage_ptr__->pg;
  uVar13 = (ulong)__return_storage_ptr__->n;
  ppVar12 = __return_storage_ptr__->p;
  lVar11 = 1;
  while( true ) {
    pgVar2 = arrays_->groups_ + pos0;
    pgVar3 = arrays_->groups_ + pos0;
    auVar15[0] = -(pgVar3->m[0].n == '\0');
    auVar15[1] = -(pgVar3->m[1].n == '\0');
    auVar15[2] = -(pgVar3->m[2].n == '\0');
    auVar15[3] = -(pgVar3->m[3].n == '\0');
    auVar15[4] = -(pgVar3->m[4].n == '\0');
    auVar15[5] = -(pgVar3->m[5].n == '\0');
    auVar15[6] = -(pgVar3->m[6].n == '\0');
    auVar15[7] = -(pgVar3->m[7].n == '\0');
    auVar15[8] = -(pgVar3->m[8].n == '\0');
    auVar15[9] = -(pgVar3->m[9].n == '\0');
    auVar15[10] = -(pgVar3->m[10].n == '\0');
    auVar15[0xb] = -(pgVar3->m[0xb].n == '\0');
    auVar15[0xc] = -(pgVar3->m[0xc].n == '\0');
    auVar15[0xd] = -(pgVar3->m[0xd].n == '\0');
    auVar15[0xe] = -(pgVar3->m[0xe].n == '\0');
    auVar15[0xf] = -(pgVar3->m[0xf].n == '\0');
    uVar9 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe;
    if (uVar9 == 0) {
      pgVar2->m[0xf].n = pgVar2->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      ppVar5 = arrays_->elements_;
      uVar8 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      uVar13 = (ulong)uVar8;
      ppVar12 = ppVar5 + pos0 * 0xf + uVar13;
      ppVar12->first = *args->first;
      pbVar6 = args->second;
      paVar4 = &ppVar5[pos0 * 0xf + uVar13].second.field_2;
      (&paVar4->_M_allocated_capacity)[-2] = (size_type)paVar4;
      pcVar7 = (pbVar6->_M_dataplus)._M_p;
      paVar1 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar7 == paVar1) {
        sVar10 = *(size_type *)((long)&pbVar6->field_2 + 8);
        paVar4->_M_allocated_capacity = paVar1->_M_allocated_capacity;
        (&paVar4->_M_allocated_capacity)[1] = sVar10;
      }
      else {
        (ppVar12->second)._M_dataplus._M_p = pcVar7;
        (ppVar12->second).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      (ppVar12->second)._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      pgVar2->m[uVar13].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar14 = pgVar2;
    }
    if (uVar9 != 0) break;
    pos0 = pos0 + lVar11 & arrays_->groups_size_mask;
    lVar11 = lVar11 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar13;
  __return_storage_ptr__->p = ppVar12;
  __return_storage_ptr__->pg = pgVar14;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }